

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

char * archive_read_disk_uname(archive *_a,int64_t uid)

{
  undefined8 uVar1;
  int iVar2;
  archive_read_disk *a;
  int64_t uid_local;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_uname");
  if (iVar2 == 0) {
    if (_a[1].error_string.buffer_length == 0) {
      _a_local = (archive *)0x0;
    }
    else {
      uVar1._0_4_ = _a[1].current_codepage;
      uVar1._4_4_ = _a[1].current_oemcp;
      _a_local = (archive *)(*(code *)_a[1].error_string.buffer_length)(uVar1,uid);
    }
  }
  else {
    _a_local = (archive *)0x0;
  }
  return (char *)_a_local;
}

Assistant:

const char *
archive_read_disk_uname(struct archive *_a, int64_t uid)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	if (ARCHIVE_OK != __archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
		ARCHIVE_STATE_ANY, "archive_read_disk_uname"))
		return (NULL);
	if (a->lookup_uname == NULL)
		return (NULL);
	return ((*a->lookup_uname)(a->lookup_uname_data, uid));
}